

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenAddMemoryImport
               (BinaryenModuleRef module,char *internalName,char *externalModuleName,
               char *externalBaseName,uint8_t shared)

{
  IString *pIVar1;
  Memory *pMVar2;
  undefined1 reuse;
  char *pcVar3;
  _Head_base<0UL,_wasm::Memory_*,_false> _Var4;
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view s_02;
  string_view s_03;
  string_view sVar5;
  _Head_base<0UL,_wasm::Memory_*,_false> local_38;
  __single_object memory;
  
  pcVar3 = externalBaseName;
  pIVar1 = (IString *)strlen(internalName);
  sVar5._M_str = (char *)0x0;
  sVar5._M_len = (size_t)internalName;
  reuse = SUB81(pcVar3,0);
  sVar5 = wasm::IString::interned(pIVar1,sVar5,(bool)reuse);
  pMVar2 = wasm::Module::getMemoryOrNull(module,(Name)sVar5);
  if (pMVar2 == (Memory *)0x0) {
    local_38._M_head_impl = (Memory *)operator_new(0x58);
    ((local_38._M_head_impl)->max).addr = 0;
    *(undefined8 *)&(local_38._M_head_impl)->shared = 0;
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len = 0;
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str =
         (char *)0x0;
    *(undefined8 *)&((local_38._M_head_impl)->super_Importable).super_Named.hasExplicitName = 0;
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len = 0;
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str = (char *)0x0;
    ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_len = 0;
    ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_str = (char *)0x0;
    ((local_38._M_head_impl)->initial).addr = 0;
    ((local_38._M_head_impl)->max).addr = 0x10000;
    (local_38._M_head_impl)->shared = false;
    ((local_38._M_head_impl)->indexType).id = 2;
    pIVar1 = (IString *)strlen(internalName);
    s_01._M_str = (char *)0x0;
    s_01._M_len = (size_t)internalName;
    sVar5 = wasm::IString::interned(pIVar1,s_01,(bool)reuse);
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str = sVar5;
    _Var4._M_head_impl = local_38._M_head_impl;
    pIVar1 = (IString *)strlen(externalModuleName);
    s_02._M_str = (char *)0x0;
    s_02._M_len = (size_t)externalModuleName;
    sVar5 = wasm::IString::interned(pIVar1,s_02,SUB81(_Var4._M_head_impl,0));
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str = sVar5;
    _Var4._M_head_impl = local_38._M_head_impl;
    pIVar1 = (IString *)strlen(externalBaseName);
    s_03._M_str = (char *)0x0;
    s_03._M_len = (size_t)externalBaseName;
    sVar5 = wasm::IString::interned(pIVar1,s_03,SUB81(_Var4._M_head_impl,0));
    ((local_38._M_head_impl)->super_Importable).base.super_IString.str = sVar5;
    (local_38._M_head_impl)->shared = shared != '\0';
    wasm::Module::addMemory
              (module,(unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)&local_38);
    if (local_38._M_head_impl != (Memory *)0x0) {
      operator_delete(local_38._M_head_impl,0x58);
    }
  }
  else {
    pIVar1 = (IString *)strlen(externalModuleName);
    s._M_str = (char *)0x0;
    s._M_len = (size_t)externalModuleName;
    sVar5 = wasm::IString::interned(pIVar1,s,(bool)reuse);
    (pMVar2->super_Importable).module.super_IString.str = sVar5;
    pIVar1 = (IString *)strlen(externalBaseName);
    s_00._M_str = (char *)0x0;
    s_00._M_len = (size_t)externalBaseName;
    sVar5 = wasm::IString::interned(pIVar1,s_00,(bool)reuse);
    (pMVar2->super_Importable).base.super_IString.str = sVar5;
  }
  return;
}

Assistant:

void BinaryenAddMemoryImport(BinaryenModuleRef module,
                             const char* internalName,
                             const char* externalModuleName,
                             const char* externalBaseName,
                             uint8_t shared) {
  auto* memory = ((Module*)module)->getMemoryOrNull(internalName);
  if (memory == nullptr) {
    auto memory = std::make_unique<Memory>();
    memory->name = internalName;
    memory->module = externalModuleName;
    memory->base = externalBaseName;
    memory->shared = shared;
    ((Module*)module)->addMemory(std::move(memory));
  } else {
    // already exists so just set module and base
    memory->module = externalModuleName;
    memory->base = externalBaseName;
  }
}